

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O1

void __thiscall
embree::sse2::FeatureAdaptiveEvalGrid::eval
          (FeatureAdaptiveEvalGrid *this,CatmullClarkPatch3fa *patch,BBox2f *srange,BBox2f *erange,
          uint depth,BezierCurve3fa *border0,BezierCurve3fa *border1,BezierCurve3fa *border2,
          BezierCurve3fa *border3)

{
  float fVar1;
  anon_struct_8_2_947311e6_for_anon_union_8_2_4062524c_for_Vec2<float>_1_0 aVar2;
  int iVar3;
  Vec3fa *ptr;
  float *pfVar4;
  float fVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int lx0;
  ulong uVar12;
  Vec3fa **ppVVar13;
  long lVar14;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *paVar15;
  ulong uVar16;
  Vec3fa **ppVVar17;
  long lVar18;
  int ly1;
  int ly0;
  DynamicStackArray<float,_16UL,_64UL> *pDVar19;
  uint uVar20;
  int lx1;
  DynamicStackArray<float,_16UL,_64UL> *pDVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  BBox2f srange3;
  BBox2f srange1;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> patches;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_34d0;
  float fStack_34c8;
  float fStack_34c4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_34c0;
  uint uStack_34b8;
  uint uStack_34b4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_34b0;
  float fStack_34a8;
  float fStack_34a4;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_34a0;
  float fStack_3498;
  float fStack_3494;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_3490;
  undefined8 uStack_3488;
  array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> local_3480;
  
  fVar1 = (erange->lower).field_0.field_0.x;
  if (fVar1 < (erange->upper).field_0.field_0.x || fVar1 == (erange->upper).field_0.field_0.x) {
    bVar11 = true;
    do {
      bVar9 = bVar11;
      if (!bVar9) goto LAB_00e4d84f;
      bVar11 = false;
    } while ((erange->lower).field_0.field_0.y <= (erange->upper).field_0.field_0.y);
    if (!bVar9) {
LAB_00e4d84f:
      fVar1 = (erange->upper).field_0.field_0.x;
      fVar30 = ceilf((erange->lower).field_0.field_0.x);
      fVar31 = ceilf(fVar1);
      uVar20 = 0;
      if ((fVar1 == (float)this->x1) &&
         (uVar20 = 1,
         fVar1 < (srange->lower).field_0.field_0.x || fVar1 == (srange->lower).field_0.field_0.x)) {
        uVar20 = -(uint)(fVar1 == 0.0) & 1;
      }
      lx1 = uVar20 + (int)fVar31;
      lx0 = (int)fVar30;
      fVar1 = (erange->upper).field_0.field_0.y;
      fVar30 = ceilf((erange->lower).field_0.field_0.y);
      fVar31 = ceilf(fVar1);
      uVar20 = 0;
      if ((fVar1 == (float)this->y1) &&
         (uVar20 = 1, pfVar4 = &(srange->lower).field_0.field_0.y,
         fVar1 < *pfVar4 || fVar1 == *pfVar4)) {
        uVar20 = -(uint)(fVar1 == 0.0) & 1;
      }
      if (lx0 < lx1) {
        ly1 = uVar20 + (int)fVar31;
        ly0 = (int)fVar30;
        if (ly0 < ly1) {
          uVar20 = (patch->ring).items[0].face_valence;
          if ((ulong)uVar20 == 0) {
            uVar12 = 0;
          }
          else {
            uVar16 = 0;
            uVar12 = 0;
            do {
              uVar12 = uVar12 + (0.0 < (patch->ring).items[0].crease_weight.data[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar20 != uVar16);
          }
          iVar3 = (patch->ring).items[0].border_index;
          bVar22 = uVar12 == (uint)(iVar3 != -1) * 2;
          bVar6 = true;
          fVar1 = (patch->ring).items[0].vertex_crease_weight;
          bVar9 = bVar22;
          bVar11 = bVar6;
          if (uVar20 == 2 && iVar3 != -1) {
            if (((fVar1 != 0.0) || (NAN(fVar1))) && (fVar1 < INFINITY)) {
              bVar9 = false;
              bVar11 = false;
            }
          }
          else {
            bVar9 = false;
            bVar11 = false;
            if (((fVar1 == 0.0) && (!NAN(fVar1))) &&
               (bVar9 = bVar22, bVar11 = bVar6, uVar20 != 3 || iVar3 == -1)) {
              bVar11 = uVar20 == 4 && iVar3 == -1;
              bVar9 = bVar11 && bVar22;
            }
          }
          uVar20 = (patch->ring).items[1].face_valence;
          if ((ulong)uVar20 == 0) {
            uVar12 = 0;
          }
          else {
            uVar16 = 0;
            uVar12 = 0;
            do {
              uVar12 = uVar12 + (0.0 < (patch->ring).items[1].crease_weight.data[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar20 != uVar16);
          }
          iVar3 = (patch->ring).items[1].border_index;
          bVar23 = uVar12 == (uint)(iVar3 != -1) * 2;
          bVar7 = true;
          fVar1 = (patch->ring).items[1].vertex_crease_weight;
          bVar22 = bVar23;
          bVar6 = bVar7;
          if (uVar20 == 2 && iVar3 != -1) {
            if (((fVar1 != 0.0) || (NAN(fVar1))) && (fVar1 < INFINITY)) {
              bVar22 = false;
              bVar6 = false;
            }
          }
          else {
            bVar22 = false;
            bVar6 = false;
            if (((fVar1 == 0.0) && (!NAN(fVar1))) &&
               (bVar22 = bVar23, bVar6 = bVar7, uVar20 != 3 || iVar3 == -1)) {
              bVar6 = uVar20 == 4 && iVar3 == -1;
              bVar22 = bVar6 && bVar23;
            }
          }
          uVar20 = (patch->ring).items[2].face_valence;
          if ((ulong)uVar20 == 0) {
            uVar12 = 0;
          }
          else {
            uVar16 = 0;
            uVar12 = 0;
            do {
              uVar12 = uVar12 + (0.0 < (patch->ring).items[2].crease_weight.data[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar20 != uVar16);
          }
          iVar3 = (patch->ring).items[2].border_index;
          bVar24 = uVar12 == (uint)(iVar3 != -1) * 2;
          bVar8 = true;
          fVar1 = (patch->ring).items[2].vertex_crease_weight;
          bVar23 = bVar24;
          bVar7 = bVar8;
          if (uVar20 == 2 && iVar3 != -1) {
            if (((fVar1 != 0.0) || (NAN(fVar1))) && (fVar1 < INFINITY)) {
              bVar23 = false;
              bVar7 = false;
            }
          }
          else {
            bVar23 = false;
            bVar7 = false;
            if (((fVar1 == 0.0) && (!NAN(fVar1))) &&
               (bVar23 = bVar24, bVar7 = bVar8, uVar20 != 3 || iVar3 == -1)) {
              bVar7 = uVar20 == 4 && iVar3 == -1;
              bVar23 = bVar7 && bVar24;
            }
          }
          uVar20 = (patch->ring).items[3].face_valence;
          if ((ulong)uVar20 == 0) {
            uVar12 = 0;
          }
          else {
            uVar16 = 0;
            uVar12 = 0;
            do {
              uVar12 = uVar12 + (0.0 < (patch->ring).items[3].crease_weight.data[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar20 != uVar16);
          }
          iVar3 = (patch->ring).items[3].border_index;
          bVar25 = uVar12 == (uint)(iVar3 != -1) * 2;
          bVar10 = true;
          fVar1 = (patch->ring).items[3].vertex_crease_weight;
          bVar24 = bVar25;
          bVar8 = bVar10;
          if (uVar20 == 2 && iVar3 != -1) {
            if (((fVar1 != 0.0) || (NAN(fVar1))) && (fVar1 < INFINITY)) {
              bVar24 = false;
              bVar8 = false;
            }
          }
          else {
            bVar24 = false;
            bVar8 = false;
            if (((fVar1 == 0.0) && (!NAN(fVar1))) &&
               (bVar24 = bVar25, bVar8 = bVar10, uVar20 != 3 || iVar3 == -1)) {
              bVar8 = uVar20 == 4 && iVar3 == -1;
              bVar24 = bVar8 && bVar25;
            }
          }
          if (depth < 10) {
            if (!(bool)(bVar22 & bVar9 & bVar23 & bVar24)) {
              ppVVar13 = &local_3480.items[0].ring.items[0].ring.data;
              lVar14 = 0;
              do {
                lVar18 = 0xd00;
                ppVVar17 = ppVVar13;
                do {
                  ppVVar17[-0x50] = (Vec3fa *)(ppVVar17 + -0x58);
                  ppVVar17[-0x47] = (Vec3fa *)0x0;
                  *ppVVar17 = (Vec3fa *)(ppVVar17 + -0x40);
                  ppVVar17 = ppVVar17 + 0x68;
                  lVar18 = lVar18 + -0x340;
                } while (lVar18 != 0);
                lVar14 = lVar14 + 0xd00;
                ppVVar13 = ppVVar13 + 0x1a0;
              } while (lVar14 != 0x3400);
              CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>::subdivide(patch,&local_3480);
              local_3490.field_0 = (srange->lower).field_0.field_0;
              local_34d0.field_0.x = local_3490.field_0.x;
              local_34a0.field_0.y = local_3490.field_0.y;
              aVar2 = (srange->upper).field_0.field_0;
              fStack_34a8 = aVar2.x;
              fStack_34a4 = aVar2.y;
              fStack_34c8 = (local_34d0.field_0.x + fStack_34a8) * 0.5;
              local_34d0.field_0.y = (local_34a0.field_0.y + fStack_34a4) * 0.5;
              uStack_3488 = CONCAT44(local_34d0.field_0.y,fStack_34c8);
              fStack_34c4 = (srange->upper).field_0.field_0.y;
              fVar1 = (erange->lower).field_0.field_0.x;
              fVar30 = (erange->lower).field_0.field_0.y;
              fVar31 = (erange->upper).field_0.field_0.x;
              fVar5 = (erange->upper).field_0.field_0.y;
              uVar20 = -(uint)(local_34d0.field_0.x < fVar1);
              uVar26 = -(uint)(local_34a0.field_0.y < fVar30);
              uVar27 = -(uint)(fStack_34c8 < fVar31);
              uVar28 = -(uint)(local_34d0.field_0.y < fVar5);
              local_34c0.field_0.x =
                   (float)(~uVar20 & (uint)local_34d0.field_0.x | (uint)fVar1 & uVar20);
              local_34c0.field_0.y =
                   (float)(~uVar26 & (uint)local_34a0.field_0.y | (uint)fVar30 & uVar26);
              uStack_34b8 = ~uVar27 & (uint)fVar31 | (uint)fStack_34c8 & uVar27;
              uStack_34b4 = ~uVar28 & (uint)fVar5 | (uint)local_34d0.field_0.y & uVar28;
              uVar20 = depth + 1;
              local_34b0.field_0.x = fStack_34c8;
              local_34b0.field_0.y = local_34d0.field_0.y;
              local_34a0.field_0.x = fStack_34c8;
              fStack_3498 = fStack_34a8;
              fStack_3494 = local_34d0.field_0.y;
              eval(this,local_3480.items,(BBox2f *)&local_3490.field_0,(BBox2f *)&local_34c0.field_0
                   ,uVar20,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
                   (BezierCurve3fa *)0x0);
              fVar1 = (erange->lower).field_0.field_0.x;
              fVar30 = (erange->lower).field_0.field_0.y;
              fVar31 = (erange->upper).field_0.field_0.x;
              fVar5 = (erange->upper).field_0.field_0.y;
              uVar26 = -(uint)(local_34a0.field_0.x < fVar1);
              uVar27 = -(uint)(local_34a0.field_0.y < fVar30);
              uVar28 = -(uint)(fStack_3498 < fVar31);
              uVar29 = -(uint)(fStack_3494 < fVar5);
              local_34c0.field_0.x =
                   (float)(~uVar26 & (uint)local_34a0.field_0.x | (uint)fVar1 & uVar26);
              local_34c0.field_0.y =
                   (float)(~uVar27 & (uint)local_34a0.field_0.y | (uint)fVar30 & uVar27);
              uStack_34b8 = ~uVar28 & (uint)fVar31 | (uint)fStack_3498 & uVar28;
              uStack_34b4 = ~uVar29 & (uint)fVar5 | (uint)fStack_3494 & uVar29;
              eval(this,local_3480.items + 1,(BBox2f *)&local_34a0.field_0,
                   (BBox2f *)&local_34c0.field_0,uVar20,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
                   (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
              fVar1 = (erange->lower).field_0.field_0.x;
              fVar30 = (erange->lower).field_0.field_0.y;
              fVar31 = (erange->upper).field_0.field_0.x;
              fVar5 = (erange->upper).field_0.field_0.y;
              uVar26 = -(uint)(local_34b0.field_0.x < fVar1);
              uVar27 = -(uint)(local_34b0.field_0.y < fVar30);
              uVar28 = -(uint)(fStack_34a8 < fVar31);
              uVar29 = -(uint)(fStack_34a4 < fVar5);
              local_34c0.field_0.x =
                   (float)(~uVar26 & (uint)local_34b0.field_0.x | (uint)fVar1 & uVar26);
              local_34c0.field_0.y =
                   (float)(~uVar27 & (uint)local_34b0.field_0.y | (uint)fVar30 & uVar27);
              uStack_34b8 = ~uVar28 & (uint)fVar31 | (uint)fStack_34a8 & uVar28;
              uStack_34b4 = ~uVar29 & (uint)fVar5 | (uint)fStack_34a4 & uVar29;
              eval(this,local_3480.items + 2,(BBox2f *)&local_34b0.field_0,
                   (BBox2f *)&local_34c0.field_0,uVar20,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
                   (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
              fVar1 = (erange->lower).field_0.field_0.x;
              fVar30 = (erange->lower).field_0.field_0.y;
              fVar31 = (erange->upper).field_0.field_0.x;
              fVar5 = (erange->upper).field_0.field_0.y;
              uVar26 = -(uint)(local_34d0.field_0.x < fVar1);
              uVar27 = -(uint)(local_34d0.field_0.y < fVar30);
              uVar28 = -(uint)(fStack_34c8 < fVar31);
              uVar29 = -(uint)(fStack_34c4 < fVar5);
              local_34c0.field_0.x =
                   (float)(~uVar26 & (uint)local_34d0.field_0.x | (uint)fVar1 & uVar26);
              local_34c0.field_0.y =
                   (float)(~uVar27 & (uint)local_34d0.field_0.y | (uint)fVar30 & uVar27);
              uStack_34b8 = ~uVar28 & (uint)fVar31 | (uint)fStack_34c8 & uVar28;
              uStack_34b4 = ~uVar29 & (uint)fVar5 | (uint)fStack_34c4 & uVar29;
              eval(this,local_3480.items + 3,(BBox2f *)&local_34d0.field_0,
                   (BBox2f *)&local_34c0.field_0,uVar20,(BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0,
                   (BezierCurve3fa *)0x0,(BezierCurve3fa *)0x0);
              paVar15 = (array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *)
                        &stack0xffffffffffffff80;
              pDVar21 = &local_3480.items[3].ring.items[3].crease_weight;
              do {
                paVar15 = (array_t<embree::CatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa>,_4UL>
                           *)(&paVar15[-1].items[0].ring + 3);
                lVar14 = -0xd00;
                pDVar19 = pDVar21;
                do {
                  ptr = *(Vec3fa **)((Vec3fa *)(pDVar19 + 5) + 4);
                  if (ptr != (Vec3fa *)0x0 &&
                      (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)((long)(pDVar19 + 1) + 0x40)
                      != (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)ptr) {
                    alignedFree(ptr);
                  }
                  pfVar4 = pDVar19->data;
                  if (pfVar4 != (float *)0x0 &&
                      pDVar19 != (DynamicStackArray<float,_16UL,_64UL> *)pfVar4) {
                    operator_delete__(pfVar4);
                  }
                  pDVar19 = (DynamicStackArray<float,_16UL,_64UL> *)((long)(pDVar19 + -7) + 0x40);
                  lVar14 = lVar14 + 0x340;
                } while (lVar14 != 0);
                pDVar21 = pDVar21 + -0x1a;
              } while (paVar15 != &local_3480);
              return;
            }
          }
          else if (!(bool)(bVar6 & bVar11 & bVar7 & bVar8)) {
            GregoryPatchT<embree::Vec3fa,_embree::Vec3fa>::init_crackfix
                      ((GregoryPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_3480,patch,border0,
                       border1,border2,border3);
            evalLocalGrid<embree::GregoryPatchT<embree::Vec3fa,embree::Vec3fa>>
                      (this,(GregoryPatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_3480,srange,lx0,
                       lx1,ly0,ly1);
            return;
          }
          BSplinePatchT<embree::Vec3fa,_embree::Vec3fa>::init
                    ((BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_3480,
                     (EVP_PKEY_CTX *)patch);
          evalLocalGrid<embree::BSplinePatchT<embree::Vec3fa,embree::Vec3fa>>
                    (this,(BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *)&local_3480,srange,lx0,
                     lx1,ly0,ly1);
        }
      }
    }
  }
  return;
}

Assistant:

void eval(const CatmullClarkPatch3fa& patch, const BBox2f& srange, const BBox2f& erange, const unsigned depth, 
                const BezierCurve3fa* border0 = nullptr, const BezierCurve3fa* border1 = nullptr, const BezierCurve3fa* border2 = nullptr, const BezierCurve3fa* border3 = nullptr)
      {
        if (erange.empty())
          return;
        
        int lx0 = (int) ceilf(erange.lower.x);
        int lx1 = (int) ceilf(erange.upper.x) + (erange.upper.x == x1 && (srange.lower.x < erange.upper.x || erange.upper.x == 0));
        int ly0 = (int) ceilf(erange.lower.y);
        int ly1 = (int) ceilf(erange.upper.y) + (erange.upper.y == y1 && (srange.lower.y < erange.upper.y || erange.upper.y == 0));
        if (lx0 >= lx1 || ly0 >= ly1) return;

        CatmullClarkPatch::Type ty = patch.type();

        if (unlikely(final(patch,ty,depth)))
        {
          if (ty & CatmullClarkRing::TYPE_REGULAR) {
            RegularPatch rpatch(patch,border0,border1,border2,border3);
            evalLocalGrid(rpatch,srange,lx0,lx1,ly0,ly1);
            return;
          } else {
            IrregularFillPatch ipatch(patch,border0,border1,border2,border3);
            evalLocalGrid(ipatch,srange,lx0,lx1,ly0,ly1);
            return;
          }
        }
        else if (ty & CatmullClarkRing::TYPE_REGULAR_CREASES) { 
          assert(depth > 0); 
          RegularPatch rpatch(patch,border0,border1,border2,border3);
          evalLocalGrid(rpatch,srange,lx0,lx1,ly0,ly1);
          return;
        }
#if PATCH_USE_GREGORY == 2
        else if (ty & CatmullClarkRing::TYPE_GREGORY_CREASES) { 
          assert(depth > 0); 
          GregoryPatch gpatch(patch,border0,border1,border2,border3);
          evalLocalGrid(gpatch,srange,lx0,lx1,ly0,ly1);
        }
#endif
        else
        {
          array_t<CatmullClarkPatch3fa,4> patches; 
          patch.subdivide(patches);
          
          const Vec2f c = srange.center();
          const BBox2f srange0(srange.lower,c);
          const BBox2f srange1(Vec2f(c.x,srange.lower.y),Vec2f(srange.upper.x,c.y));
          const BBox2f srange2(c,srange.upper);
          const BBox2f srange3(Vec2f(srange.lower.x,c.y),Vec2f(c.x,srange.upper.y));
          
          eval(patches[0],srange0,intersect(srange0,erange),depth+1);
          eval(patches[1],srange1,intersect(srange1,erange),depth+1);
          eval(patches[2],srange2,intersect(srange2,erange),depth+1);
          eval(patches[3],srange3,intersect(srange3,erange),depth+1);
        }